

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbinode.cpp
# Opt level: O1

RBBINode * __thiscall icu_63::RBBINode::cloneTree(RBBINode *this)

{
  RBBINode *this_00;
  RBBINode *pRVar1;
  size_t in_RSI;
  
  for (; this->fType == varRef; this = this->fLeftChild) {
  }
  this_00 = this;
  if (this->fType != uset) {
    this_00 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,in_RSI);
    if (this_00 == (RBBINode *)0x0) {
      this_00 = (RBBINode *)0x0;
    }
    else {
      RBBINode(this_00,this);
    }
    if (this_00 == (RBBINode *)0x0) {
      this_00 = (RBBINode *)0x0;
    }
    else {
      if (this->fLeftChild != (RBBINode *)0x0) {
        pRVar1 = cloneTree(this->fLeftChild);
        this_00->fLeftChild = pRVar1;
        pRVar1->fParent = this_00;
      }
      if (this->fRightChild != (RBBINode *)0x0) {
        pRVar1 = cloneTree(this->fRightChild);
        this_00->fRightChild = pRVar1;
        pRVar1->fParent = this_00;
      }
    }
  }
  return this_00;
}

Assistant:

RBBINode *RBBINode::cloneTree() {
    RBBINode    *n;

    if (fType == RBBINode::varRef) {
        // If the current node is a variable reference, skip over it
        //   and clone the definition of the variable instead.
        n = fLeftChild->cloneTree();
    } else if (fType == RBBINode::uset) {
        n = this;
    } else {
        n = new RBBINode(*this);
        // Check for null pointer.
        if (n != NULL) {
            if (fLeftChild != NULL) {
                n->fLeftChild          = fLeftChild->cloneTree();
                n->fLeftChild->fParent = n;
            }
            if (fRightChild != NULL) {
                n->fRightChild          = fRightChild->cloneTree();
                n->fRightChild->fParent = n;
            }
        }
    }
    return n;
}